

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

bool __thiscall
HPresolve::removeColumnSingletonInDoubletonInequality(HPresolve *this,int col,int i,int k)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  reference pvVar5;
  ostream *poVar6;
  reference pvVar7;
  int in_EDX;
  int in_ESI;
  int iVar8;
  long in_RDI;
  double extraout_XMM0_Qa;
  HPresolve *this_00;
  pair<double,_double> pVar9;
  pair<int,_double> pVar10;
  vector<double,_std::allocator<double>_> bndsJ;
  vector<double,_std::allocator<double>_> bndsCol;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> costS;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> bndsU;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> bndsL;
  double upp;
  double low;
  pair<double,_double> p;
  int kk;
  int j;
  undefined4 in_stack_fffffffffffffbe8;
  int in_stack_fffffffffffffbec;
  HTimerPre *in_stack_fffffffffffffbf0;
  int *in_stack_fffffffffffffbf8;
  HPresolve *in_stack_fffffffffffffc00;
  allocator_type *in_stack_fffffffffffffc18;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffc20;
  iterator in_stack_fffffffffffffc28;
  size_type __n;
  size_type in_stack_fffffffffffffc30;
  double in_stack_fffffffffffffc80;
  double in_stack_fffffffffffffc88;
  undefined8 in_stack_fffffffffffffc90;
  int j_00;
  value_type vVar11;
  undefined8 in_stack_fffffffffffffc98;
  HPresolve *in_stack_fffffffffffffca0;
  value_type local_168;
  value_type local_160;
  value_type local_158;
  value_type *local_150;
  undefined8 local_148;
  value_type local_120;
  value_type local_118;
  value_type local_110;
  value_type *local_108;
  undefined8 local_100;
  int local_e0;
  double local_d8;
  int local_d0;
  double local_c8;
  int local_b0;
  double local_a8;
  double local_58;
  double local_50;
  pair<double,_double> local_48;
  pair<double,_double> local_38;
  int local_24;
  int local_20;
  int local_18;
  int local_14;
  byte local_1;
  
  local_20 = -1;
  local_18 = in_EDX;
  local_14 = in_ESI;
  pvVar5 = std::vector<int,_std::allocator<int>_>::at
                     ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0,
                      CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  local_24 = *pvVar5;
  while( true ) {
    iVar8 = local_24;
    pvVar5 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0,
                        CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    j_00 = (int)((ulong)in_stack_fffffffffffffc90 >> 0x20);
    if (*pvVar5 <= iVar8) break;
    pvVar5 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0,
                        CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    local_20 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0,
                        CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    j_00 = (int)((ulong)in_stack_fffffffffffffc90 >> 0x20);
    if ((*pvVar5 != 0) && (local_20 != local_14)) break;
    local_24 = local_24 + 1;
  }
  iVar8 = local_24;
  pvVar5 = std::vector<int,_std::allocator<int>_>::at
                     ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0,
                      CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  if (iVar8 == *pvVar5) {
    poVar6 = std::operator<<((ostream *)&std::cout,"ERROR: nzRow[");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_18);
    std::operator<<(poVar6,"]=2, but no second variable in row. \n");
  }
  std::vector<double,_std::allocator<double>_>::at
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
             CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  iVar8 = (int)in_RDI + 0xc0;
  std::vector<double,_std::allocator<double>_>::at
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
             CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  std::abs(iVar8);
  if ((*(double *)(in_RDI + 0xae8) <= extraout_XMM0_Qa) ||
     (pvVar5 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0,
                          CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8)),
     *pvVar5 < 2)) {
    HTimerPre::recordStart(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
    std::vector<double,_std::allocator<double>_>::at
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
               CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    std::vector<double,_std::allocator<double>_>::at
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
               CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    pVar9 = getNewBoundsDoubletonConstraint
                      (in_stack_fffffffffffffca0,(int)((ulong)in_stack_fffffffffffffc98 >> 0x20),
                       (int)in_stack_fffffffffffffc98,j_00,in_stack_fffffffffffffc88,
                       in_stack_fffffffffffffc80);
    local_38.first = pVar9.first;
    local_38.second = pVar9.second;
    pvVar7 = std::vector<double,_std::allocator<double>_>::at
                       ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                        CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    if ((local_38.first < *pvVar7) ||
       (pvVar7 = std::vector<double,_std::allocator<double>_>::at
                           ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                            CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8)),
       *pvVar7 < local_38.second)) {
      HTimerPre::recordFinish(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      local_1 = 0;
    }
    else {
      std::vector<double,_std::allocator<double>_>::at
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                 CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      std::stack<double,_std::deque<double,_std::allocator<double>_>_>::push
                ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)
                 in_stack_fffffffffffffbf0,
                 (value_type *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      std::vector<double,_std::allocator<double>_>::at
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                 CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      std::stack<double,_std::deque<double,_std::allocator<double>_>_>::push
                ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)
                 in_stack_fffffffffffffbf0,
                 (value_type *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      std::vector<double,_std::allocator<double>_>::at
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                 CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      std::vector<double,_std::allocator<double>_>::at
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                 CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      pVar9 = getNewBoundsDoubletonConstraint
                        (in_stack_fffffffffffffca0,(int)((ulong)in_stack_fffffffffffffc98 >> 0x20),
                         (int)in_stack_fffffffffffffc98,j_00,in_stack_fffffffffffffc88,
                         in_stack_fffffffffffffc80);
      local_48.first = pVar9.first;
      local_48.second = pVar9.second;
      std::pair<double,_double>::operator=(&local_38,&local_48);
      local_50 = local_38.first;
      local_58 = local_38.second;
      if (*(int *)(in_RDI + 0x7cc) == 1) {
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
                  ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   0x1a09a5);
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
                  ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   0x1a09b2);
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
                  ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   0x1a09bf);
        std::vector<double,_std::allocator<double>_>::at
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                   CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
        pVar10 = std::make_pair<int&,double&>
                           ((int *)in_stack_fffffffffffffbf0,
                            (double *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8))
        ;
        local_a8 = pVar10.second;
        local_b0 = pVar10.first;
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::push_back
                  ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   in_stack_fffffffffffffbf0,
                   (value_type *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
        std::vector<double,_std::allocator<double>_>::at
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                   CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
        pVar10 = std::make_pair<int&,double&>
                           ((int *)in_stack_fffffffffffffbf0,
                            (double *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8))
        ;
        local_c8 = pVar10.second;
        local_d0 = pVar10.first;
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::push_back
                  ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   in_stack_fffffffffffffbf0,
                   (value_type *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
        std::vector<double,_std::allocator<double>_>::at
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                   CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
        pVar10 = std::make_pair<int&,double&>
                           ((int *)in_stack_fffffffffffffbf0,
                            (double *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8))
        ;
        local_d8 = pVar10.second;
        local_e0 = pVar10.first;
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::push_back
                  ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   in_stack_fffffffffffffbf0,
                   (value_type *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
        std::
        stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
        ::push((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
                *)in_stack_fffffffffffffbf0,
               (value_type *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
        std::
        stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
        ::push((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
                *)in_stack_fffffffffffffbf0,
               (value_type *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
        std::
        stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
        ::push((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
                *)in_stack_fffffffffffffbf0,
               (value_type *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~vector
                  ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   in_stack_fffffffffffffc00);
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~vector
                  ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   in_stack_fffffffffffffc00);
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~vector
                  ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   in_stack_fffffffffffffc00);
      }
      pvVar7 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                          CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      local_120 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                          CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      local_118 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                          CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      local_110 = *pvVar7;
      local_108 = &local_120;
      local_100 = 3;
      std::allocator<double>::allocator((allocator<double> *)0x1a0cae);
      __l._M_len = in_stack_fffffffffffffc30;
      __l._M_array = in_stack_fffffffffffffc28;
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_fffffffffffffc20,__l,in_stack_fffffffffffffc18);
      std::allocator<double>::~allocator((allocator<double> *)0x1a0ce2);
      pvVar7 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                          CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      local_168 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                          CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      local_160 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                          CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      local_158 = *pvVar7;
      local_150 = &local_168;
      local_148 = 3;
      std::allocator<double>::allocator((allocator<double> *)0x1a0de4);
      __l_00._M_len = in_stack_fffffffffffffc30;
      __l_00._M_array = in_stack_fffffffffffffc28;
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_fffffffffffffc20,__l_00,in_stack_fffffffffffffc18);
      std::allocator<double>::~allocator((allocator<double> *)0x1a0e18);
      std::make_pair<int_const&,std::vector<double,std::allocator<double>>&>
                (in_stack_fffffffffffffbf8,
                 (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0);
      std::
      stack<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>_>
      ::push((stack<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>_>
              *)in_stack_fffffffffffffbf0,
             (value_type *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      std::pair<int,_std::vector<double,_std::allocator<double>_>_>::~pair
                ((pair<int,_std::vector<double,_std::allocator<double>_>_> *)0x1a0e71);
      std::make_pair<int&,std::vector<double,std::allocator<double>>&>
                (in_stack_fffffffffffffbf8,
                 (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0);
      std::
      stack<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>_>
      ::push((stack<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>_>
              *)in_stack_fffffffffffffbf0,
             (value_type *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      std::pair<int,_std::vector<double,_std::allocator<double>_>_>::~pair
                ((pair<int,_std::vector<double,_std::allocator<double>_>_> *)0x1a0eca);
      dVar1 = local_50;
      pvVar7 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                          CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      dVar2 = local_50;
      if (*pvVar7 <= dVar1 && dVar1 != *pvVar7) {
        pvVar7 = std::vector<double,_std::allocator<double>_>::at
                           ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                            CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
        *pvVar7 = dVar2;
      }
      dVar1 = local_58;
      pvVar7 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                          CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      dVar2 = local_58;
      if (dVar1 < *pvVar7) {
        pvVar7 = std::vector<double,_std::allocator<double>_>::at
                           ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                            CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
        *pvVar7 = dVar2;
      }
      pvVar7 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                          CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      dVar1 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                          CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      dVar2 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                          CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      dVar3 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                          CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      dVar4 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                          CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      *pvVar7 = dVar1 - (dVar2 * dVar3) / dVar4;
      pvVar7 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                          CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      vVar11 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                          CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      *pvVar7 = vVar11;
      pvVar7 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                          CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      vVar11 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                          CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      *pvVar7 = vVar11;
      pvVar7 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                          CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      vVar11 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                          CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      *pvVar7 = vVar11;
      std::make_pair<int&,std::vector<double,std::allocator<double>>&>
                (in_stack_fffffffffffffbf8,
                 (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0);
      std::
      stack<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>_>
      ::push((stack<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>_>
              *)in_stack_fffffffffffffbf0,
             (value_type *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      std::pair<int,_std::vector<double,_std::allocator<double>_>_>::~pair
                ((pair<int,_std::vector<double,_std::allocator<double>_>_> *)0x1a13ab);
      if (0 < *(int *)(in_RDI + 0x7c8)) {
        poVar6 = std::operator<<((ostream *)&std::cout,"PR: Column singleton ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_14);
        poVar6 = std::operator<<(poVar6," in a doubleton inequality constraint removed. Row ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_18);
        poVar6 = std::operator<<(poVar6," removed. variable left is ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_20);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
      pvVar5 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0,
                          CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      *pvVar5 = 0;
      fillStackRowBounds(in_stack_fffffffffffffc00,(int)((ulong)in_stack_fffffffffffffbf8 >> 0x20));
      __n = 8;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xad0),8);
      *pvVar5 = *pvVar5 + 1;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xab8),__n);
      *pvVar5 = *pvVar5 + 1;
      pvVar7 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                          CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      *pvVar7 = 0.0;
      pvVar7 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                          CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      dVar1 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                          CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      this_00 = (HPresolve *)(-dVar1 / *pvVar7);
      pvVar7 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0,
                          CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      *pvVar7 = (value_type)this_00;
      addChange(this_00,(int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
                (int)in_stack_fffffffffffffbf8,(int)((ulong)in_stack_fffffffffffffbf0 >> 0x20));
      pvVar5 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0,
                          CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      if (*pvVar5 < 2) {
        in_stack_fffffffffffffbf0 =
             (HTimerPre *)
             std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0,
                        CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
        if (*(int *)in_stack_fffffffffffffbf0->itemTicks == 1) {
          removeSecondColumnSingletonInDoubletonRow
                    (this_00,(int)((ulong)pvVar5 >> 0x20),(int)pvVar5);
        }
      }
      else {
        removeRow(this_00,(int)((ulong)pvVar5 >> 0x20));
      }
      HTimerPre::recordFinish(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      local_1 = 1;
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)this_00);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)this_00);
    }
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool HPresolve::removeColumnSingletonInDoubletonInequality(const int col, const int i, const int k) {
	//second column index j
	//second column row array index kk
	int j = -1;

	//count
	int kk = ARstart.at(i);
	while (kk<ARstart.at(i+1)) {
		j = ARindex.at(kk);
		if (flagCol.at(j) && j!=col)
			break;
		else
			++kk;
	}
	if (kk==ARstart.at(i+1))
		cout<<"ERROR: nzRow["<< i<< "]=2, but no second variable in row. \n";

	//only inequality case and case two singletons here,
	//others handled in doubleton equation
	if ((abs(rowLower.at(i) - rowUpper.at(i)) < tol) && (nzCol.at(j) > 1))
		return false;

	timer.recordStart(SING_COL_DOUBLETON_INEQ);
	// additional check if it is indeed implied free
	// needed since we handle inequalities and it may not be true
	// low and upp to be tighter than original bounds for variable col
	// so it is indeed implied free and we can remove it
	pair<double, double> p = getNewBoundsDoubletonConstraint(i, j, col, ARvalue.at(kk), Avalue.at(k));
	if (!(colLower.at(col) <= p.first && colUpper.at(col) >= p.second)) {
		timer.recordFinish(SING_COL_DOUBLETON_INEQ);
		return false;
	}

	postValue.push(ARvalue.at(kk));
	postValue.push(Avalue.at(k));

	//modify bounds on variable j, variable col (k) is substituted out
	//double aik = Avalue.at(k);
	//double aij = Avalue.at(kk);
	p = getNewBoundsDoubletonConstraint(i, col, j, Avalue.at(k), ARvalue.at(kk));
	double low = p.first;
	double upp = p.second;

	//add old bounds of xj to checker and for postsolve
	if (iKKTcheck == 1) {
		vector<pair<int, double> > bndsL, bndsU, costS;
		bndsL.push_back( make_pair( j, colLower.at(j)));
		bndsU.push_back( make_pair( j, colUpper.at(j)));
		costS.push_back( make_pair( j, colCost.at(j)));
		chk.cLowers.push(bndsL);
		chk.cUppers.push(bndsU);
		chk.costs.push(costS);
	}

	vector<double> bndsCol({colLower.at(col), colUpper.at(col), colCost.at(col)});
	vector<double> bndsJ({colLower.at(j), colUpper.at(j), colCost.at(j)});
	oldBounds.push(make_pair( col, bndsCol));
	oldBounds.push(make_pair( j, bndsJ));

	//modify bounds of xj
	if (low > colLower.at(j))
		colLower.at(j) = low;
	if (upp < colUpper.at(j))
		colUpper.at(j) = upp;

	//modify cost of xj
	colCost.at(j) = colCost.at(j) - colCost.at(col)*ARvalue.at(kk)/Avalue.at(k);

	//for postsolve: need the new bounds too
	//oldBounds.push_back(colLower.at(j)); oldBounds.push_back(colUpper.at(j));
	bndsJ.at(0) = (colLower.at(j));
	bndsJ.at(1) = (colUpper.at(j));
	bndsJ.at(2) = (colCost.at(j));
	oldBounds.push(make_pair( j, bndsJ));

	//remove col as free column singleton
	if (iPrint > 0)
		cout<<"PR: Column singleton "<<col<<" in a doubleton inequality constraint removed. Row "<<i<<" removed. variable left is "<<j<<endl;

	flagCol.at(col) = 0;
	fillStackRowBounds(i);
	countRemovedCols[SING_COL_DOUBLETON_INEQ]++;
	countRemovedRows[SING_COL_DOUBLETON_INEQ]++;

	valueColDual.at(col) = 0;
	valueRowDual.at(i) = -colCost.at(col)/Avalue.at(k); //may be changed later, depending on bounds.
	addChange(SING_COL_DOUBLETON_INEQ, i, col);

	//if not special case two column singletons
	if (nzCol.at(j) > 1)
		removeRow(i);
	else if (nzCol.at(j)==1)
		removeSecondColumnSingletonInDoubletonRow(j, i);

	timer.recordFinish(SING_COL_DOUBLETON_INEQ);
	return true;
}